

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

void __thiscall
minja::IfExpr::IfExpr
          (IfExpr *this,Location *loc,shared_ptr<minja::Expression> *c,
          shared_ptr<minja::Expression> *t,shared_ptr<minja::Expression> *e)

{
  Expression *in_RDI;
  Location *in_stack_ffffffffffffffc8;
  
  Expression::Expression(in_RDI,in_stack_ffffffffffffffc8);
  in_RDI->_vptr_Expression = (_func_int **)&PTR_do_evaluate_00427f38;
  std::shared_ptr<minja::Expression>::shared_ptr
            ((shared_ptr<minja::Expression> *)in_RDI,
             (shared_ptr<minja::Expression> *)in_stack_ffffffffffffffc8);
  std::shared_ptr<minja::Expression>::shared_ptr
            ((shared_ptr<minja::Expression> *)in_RDI,
             (shared_ptr<minja::Expression> *)in_stack_ffffffffffffffc8);
  std::shared_ptr<minja::Expression>::shared_ptr
            ((shared_ptr<minja::Expression> *)in_RDI,
             (shared_ptr<minja::Expression> *)in_stack_ffffffffffffffc8);
  return;
}

Assistant:

IfExpr(const Location & loc, std::shared_ptr<Expression> && c, std::shared_ptr<Expression> && t, std::shared_ptr<Expression> && e)
        : Expression(loc), condition(std::move(c)), then_expr(std::move(t)), else_expr(std::move(e)) {}